

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool wasm::String::wildcardMatch(string *pattern,string *value)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sVar4 = 0;
  while( true ) {
    if (pattern->_M_string_length == sVar4) {
      return value->_M_string_length == pattern->_M_string_length;
    }
    cVar1 = (pattern->_M_dataplus)._M_p[sVar4];
    if (cVar1 == '*') break;
    if ((value->_M_string_length == sVar4) || (cVar1 != (value->_M_dataplus)._M_p[sVar4])) {
      return false;
    }
    sVar4 = sVar4 + 1;
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)pattern);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
  bVar2 = wildcardMatch(&local_b0,&local_90);
  bVar3 = true;
  if (!bVar2) {
    if (value->_M_string_length == 0) {
      bVar3 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)pattern);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
      bVar3 = wildcardMatch(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return bVar3;
}

Assistant:

inline bool wildcardMatch(const std::string& pattern,
                          const std::string& value) {
  for (size_t i = 0; i < pattern.size(); i++) {
    if (pattern[i] == '*') {
      return wildcardMatch(pattern.substr(i + 1), value.substr(i)) ||
             (value.size() > 0 &&
              wildcardMatch(pattern.substr(i), value.substr(i + 1)));
    }
    if (i >= value.size()) {
      return false;
    }
    if (pattern[i] != value[i]) {
      return false;
    }
  }
  return value.size() == pattern.size();
}